

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O2

int __thiscall
cbtAlignedObjectArray<cbtBroadphasePair>::findLinearSearch
          (cbtAlignedObjectArray<cbtBroadphasePair> *this,cbtBroadphasePair *key)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  undefined8 uVar4;
  cbtBroadphasePair *pcVar5;
  ulong uVar6;
  
  auVar1._0_8_ = key->m_pProxy0;
  auVar1._8_8_ = key->m_pProxy1;
  uVar3 = this->m_size;
  pcVar5 = this->m_data;
  uVar6 = 0;
  while( true ) {
    if ((~((int)uVar3 >> 0x1f) & uVar3) == uVar6) {
      return uVar3;
    }
    auVar2._0_8_ = pcVar5->m_pProxy0;
    auVar2._8_8_ = pcVar5->m_pProxy1;
    uVar4 = vpcmpeqq_avx512vl(auVar1,auVar2);
    if (((byte)uVar4 & 3) == 3) break;
    uVar6 = uVar6 + 1;
    pcVar5 = pcVar5 + 1;
  }
  return (int)uVar6;
}

Assistant:

int findLinearSearch(const T& key) const
	{
		int index = size();
		int i;

		for (i = 0; i < size(); i++)
		{
			if (m_data[i] == key)
			{
				index = i;
				break;
			}
		}
		return index;
	}